

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O2

void t6(void)

{
  int iVar1;
  
  puts("Trigger tests");
  gpioWrite(0x19,0);
  t6_count = 0;
  t6_on = 0;
  t6_on_tick = 0;
  gpioSetAlertFunc(0x19,t6cbf);
  for (iVar1 = 10; iVar1 != 0x3c; iVar1 = iVar1 + 10) {
    time_sleep(0x3fb999999999999a);
    gpioTrigger(0x19,iVar1,1);
  }
  time_sleep(0x3fc999999999999a);
  CHECK(6,1,t6_count,5,0,"gpio trigger count");
  CHECK(6,2,t6_on,0x96,0x19,"gpio trigger pulse length");
  return;
}

Assistant:

void t6()
{
   int tp, t, p;

   printf("Trigger tests\n");

   gpioWrite(GPIO, PI_LOW);

   tp = 0;

   t6_count=0;
   t6_on=0;
   t6_on_tick=0;

   gpioSetAlertFunc(GPIO, t6cbf);

   for (t=0; t<5; t++)
   {
      time_sleep(0.1);
      p = 10 + (t*10);
      tp += p;
      gpioTrigger(GPIO, p, 1);
   }

   time_sleep(0.2);

   CHECK(6, 1, t6_count, 5, 0, "gpio trigger count");

   CHECK(6, 2, t6_on, tp, 25, "gpio trigger pulse length");
}